

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O1

Data2D<int> * __thiscall
TasGrid::GridWavelet::buildUpdateMap
          (Data2D<int> *__return_storage_ptr__,GridWavelet *this,double tolerance,
          TypeRefinement criteria,int output)

{
  int iVar1;
  size_t sVar2;
  pointer piVar3;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  pointer pdVar7;
  int iVar8;
  size_t sVar9;
  pointer pdVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  vector<double,_std::allocator<double>_> norm;
  Data2D<int> indexes;
  Data2D<double> vals;
  SplitDirections split;
  GridWavelet direction_grid;
  _func_int **local_328;
  vector<double,_std::allocator<double>_> local_2f8;
  long local_2e0;
  size_t local_2d8;
  vector<int,_std::allocator<int>_> local_2d0;
  Data2D<double> local_2b8;
  long local_290;
  pointer local_288;
  MultiIndexSet local_280;
  SplitDirections local_258;
  undefined1 local_228 [216];
  size_t local_150;
  pointer local_140;
  
  iVar8 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  sVar14 = (size_t)iVar8;
  sVar15 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  local_258.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = -(uint)(tolerance == 0.0) & 1;
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_228,sVar15 * sVar14,
             (value_type_conflict3 *)&local_258,(allocator_type *)&local_2b8);
  __return_storage_ptr__->stride = sVar15;
  __return_storage_ptr__->num_strips = sVar14;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_228._0_8_;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_228._8_8_;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_228._16_8_;
  if ((tolerance != 0.0) || (NAN(tolerance))) {
    local_328 = (_func_int **)local_228._0_8_;
    getNormalization(&local_2f8,this);
    if (criteria < refine_direction_selective) {
      if (0 < iVar8) {
        sVar2 = (this->coefficients).stride;
        pdVar7 = (this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar9 = 0;
        pdVar10 = pdVar7;
        do {
          if (output == -1) {
            lVar11 = (long)(this->super_BaseCanonicalGrid).num_outputs;
            if (lVar11 != 0) {
              bVar5 = true;
              lVar12 = 0;
              do {
                if ((bVar5) &&
                   (tolerance <
                    ABS(pdVar10[lVar12]) /
                    local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12])) {
                  bVar5 = false;
                }
                lVar12 = lVar12 + 1;
              } while (lVar11 != lVar12);
              goto LAB_0016ed8b;
            }
          }
          else {
            bVar5 = ABS(pdVar7[sVar2 * sVar9 + (long)output]) /
                    local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[output] <= tolerance;
LAB_0016ed8b:
            if ((!bVar5) &&
               (lVar11 = (long)(this->super_BaseCanonicalGrid).num_dimensions, lVar11 != 0)) {
              lVar12 = 0;
              do {
                *(undefined4 *)((long)local_328 + lVar12) = 1;
                lVar12 = lVar12 + 4;
              } while (lVar11 * 4 != lVar12);
            }
          }
          sVar9 = sVar9 + 1;
          pdVar10 = pdVar10 + sVar2;
          local_328 = (_func_int **)((long)local_328 + sVar15 * 4);
        } while (sVar9 != sVar14);
      }
    }
    else {
      HierarchyManipulations::SplitDirections::SplitDirections
                (&local_258,&(this->super_BaseCanonicalGrid).points);
      if (0 < (int)((ulong)((long)local_258.job_pnts.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_258.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        lVar11 = 0;
        do {
          iVar8 = 1;
          if (output == -1) {
            iVar8 = (this->super_BaseCanonicalGrid).num_outputs;
          }
          piVar3 = local_258.job_pnts.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar11].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          iVar1 = *(int *)(CONCAT44(local_258.job_directions.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    (uint)local_258.job_directions.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start) + lVar11 * 4);
          local_2b8.stride = (size_t)iVar8;
          uVar13 = (uint)((ulong)((long)local_258.job_pnts.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
          sVar14 = (size_t)(int)uVar13;
          local_2b8.num_strips = sVar14;
          local_290 = lVar11;
          ::std::vector<double,_std::allocator<double>_>::vector
                    (&local_2b8.vec,local_2b8.stride * sVar14,(allocator_type *)local_228);
          local_2e0 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
          local_2d8 = sVar14;
          ::std::vector<int,_std::allocator<int>_>::vector
                    (&local_2d0,sVar14 * local_2e0,(allocator_type *)local_228);
          if (0 < (int)uVar13) {
            uVar6 = 0;
            do {
              pdVar7 = (this->super_BaseCanonicalGrid).values.values.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start +
                       (long)piVar3[uVar6] * (this->super_BaseCanonicalGrid).values.num_outputs;
              if (output == -1) {
                lVar11 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                if (lVar11 != 0) {
                  memmove(local_2b8.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + local_2b8.stride * uVar6,pdVar7,
                          lVar11 << 3);
                }
              }
              else {
                local_2b8.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[local_2b8.stride * uVar6] = pdVar7[output];
              }
              lVar11 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
              if (0 < lVar11) {
                memmove(local_2d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + local_2e0 * uVar6,
                        (this->super_BaseCanonicalGrid).points.indexes.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start +
                        (long)piVar3[uVar6] * (this->super_BaseCanonicalGrid).points.num_dimensions,
                        lVar11 << 2);
              }
              uVar6 = uVar6 + 1;
            } while ((uVar13 & 0x7fffffff) != uVar6);
          }
          local_280.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_2d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_280.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_2d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_280.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_2d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_280.num_dimensions = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
          local_2d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_2d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_2d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_280.cache_num_indexes =
               (int)((ulong)((long)local_280.indexes.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_280.indexes.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2) /
                    local_280.num_dimensions);
          GridWavelet((GridWavelet *)local_228,(this->super_BaseCanonicalGrid).acceleration,
                      &local_280,iVar8,this->order,&local_2b8);
          if (local_280.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_280.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_280.indexes.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_280.indexes.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (0 < (int)uVar13) {
            sVar14 = (this->coefficients).stride;
            pdVar7 = (this->coefficients).vec.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            local_288 = local_140;
            uVar6 = 0;
            pdVar10 = local_140;
            do {
              lVar11 = sVar14 * (long)piVar3[uVar6];
              if (output == -1) {
                lVar12 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                if (lVar12 < 1) {
                  uVar4 = 0;
                }
                else {
                  bVar5 = true;
                  lVar16 = 0;
                  do {
                    if (((bVar5) &&
                        (tolerance <
                         ABS(pdVar7[lVar11 + lVar16]) /
                         local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar16])) &&
                       (tolerance <
                        ABS(pdVar10[lVar16]) /
                        local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar16])) {
                      bVar5 = false;
                    }
                    lVar16 = lVar16 + 1;
                  } while (lVar12 != lVar16);
                  uVar4 = (uint)(~bVar5 & 1);
                }
              }
              else {
                uVar4 = 0;
                if ((tolerance <
                     ABS(pdVar7[lVar11 + output]) /
                     local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[output]) &&
                   (uVar4 = 0,
                   tolerance <
                   ABS(local_140[local_150 * uVar6]) /
                   local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[output])) {
                  uVar4 = 1;
                }
              }
              *(uint *)(local_228._0_8_ + (long)piVar3[uVar6] * sVar15 * 4 + (long)iVar1 * 4) =
                   uVar4;
              uVar6 = uVar6 + 1;
              pdVar10 = pdVar10 + local_150;
            } while (uVar6 != (uVar13 & 0x7fffffff));
          }
          ~GridWavelet((GridWavelet *)local_228);
          if (local_2d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_2d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_2d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_2b8.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2b8.vec.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2b8.vec.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2b8.vec.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar11 = local_290 + 1;
        } while (lVar11 < (int)((ulong)((long)local_258.job_pnts.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_258.job_pnts.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
      HierarchyManipulations::SplitDirections::~SplitDirections(&local_258);
    }
    if (local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridWavelet::buildUpdateMap(double tolerance, TypeRefinement criteria, int output) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        // classic refinement
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = coefficients.getStrip(i);
            if (output == -1){
                for(size_t k=0; k<((size_t) num_outputs); k++){
                    if (small && ((std::abs(s[k]) / norm[k]) > tolerance)) small = false;
                }
            }else{
                small = !((std::abs(s[output]) / norm[output]) > tolerance);
            }
            if (!small){
                int *p = pmap.getStrip(i);
                std::fill(p, p + num_dimensions, 1);
            }
        }
    }else{
        HierarchyManipulations::SplitDirections split(points);

        for(int s=0; s<split.getNumJobs(); s++){
            int d = split.getJobDirection(s);
            int nump = split.getJobNumPoints(s);
            const int *pnts = split.getJobPoints(s);

            int active_outputs = (output == -1) ? num_outputs : 1;

            Data2D<double> vals(active_outputs, nump);
            Data2D<int> indexes(num_dimensions, nump);

            for(int i=0; i<nump; i++){
                const double* v = values.getValues(pnts[i]);
                double *vls = vals.getStrip(i);
                if (output == -1){
                    std::copy(v, v + num_outputs, vls);
                }else{
                    vls[0] = v[output];
                }
                std::copy_n(points.getIndex(pnts[i]), num_dimensions, indexes.getStrip(i));
            }

            GridWavelet direction_grid(acceleration, {(size_t) num_dimensions, indexes.release()}, active_outputs, order, std::move(vals));

            for(int i=0; i<nump; i++){
                bool small = true;
                const double *coeff = direction_grid.coefficients.getStrip(i);
                const double *soeff = coefficients.getStrip(pnts[i]);
                if (output == -1){
                    for(int k=0; k<num_outputs; k++){
                        if (small && ((std::abs(soeff[k]) / norm[k]) > tolerance) && ((std::abs(coeff[k]) / norm[k]) > tolerance)) small = false;
                    }
                }else{
                    if (((std::abs(soeff[output]) / norm[output]) > tolerance) && ((std::abs(coeff[0]) / norm[output]) > tolerance)) small = false;
                }
                pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;
            }
        }
    }
    return pmap;
}